

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_subroutine_call(Parser *this)

{
  VM_Writer *pVVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  undefined1 local_1c0 [8];
  string method_name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [8];
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  string type_name;
  string local_30;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  Tokenizer::get_current_token_abi_cxx11_(&local_30,this->tokenizer);
  bVar2 = std::operator==(&local_30,".");
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_60,(string *)&this->prev_token);
    poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>.</symbol>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"IDENTIFIER",&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,".",&local_a9);
    check_token_type_x_after_y(this,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    poVar4 = (ostream *)this->out_file;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&method_name.field_2 + 8),"\t\t\t\t\t<identifier>",&this->cur_token);
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&method_name.field_2 + 8),"</identifier>");
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)(method_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_110,(string *)&this->cur_token);
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"(",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,".",&local_159);
    check_expected_x_after_y(this,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>(</symbol>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    query_tokenizer(this);
    bVar2 = std::operator!=(&this->cur_token,")");
    if (bVar2) {
      parse_expression_list(this);
      pVVar1 = this->vm_writer;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&method_name_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     ".");
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&method_name_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
      ;
      iVar3 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      VM_Writer::write_call(pVVar1,&local_180,iVar3);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)(method_name_1.field_2._M_local_buf + 8));
    }
    else {
      poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      query_tokenizer(this);
    }
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    bVar2 = std::operator==(&this->cur_token,"(");
    if (bVar2) {
      std::__cxx11::string::string((string *)local_1c0,(string *)&this->prev_token);
      poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>(</symbol>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      query_tokenizer(this);
      bVar2 = std::operator!=(&this->cur_token,")");
      if (bVar2) {
        parse_expression_list(this);
        pVVar1 = this->vm_writer;
        iVar3 = Symbol_Table::get_arg_count(&this->symbol_table,(string *)local_1c0);
        VM_Writer::write_call(pVVar1,(string *)local_1c0,iVar3 + 1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,")",&local_1e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"(",&local_209);
        check_expected_x_after_y(this,&local_1e0,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        query_tokenizer(this);
      }
      std::__cxx11::string::~string((string *)local_1c0);
    }
  }
  return;
}

Assistant:

void Parser::parse_subroutine_call() {
    // only to be called once we know Tokenizer::type() == "IDENTIFIER"

    if (tokenizer.get_current_token() == ".") {
        std::string type_name = prev_token;
        out_file << "\t\t\t\t\t<symbol>.</symbol>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", ".");
        out_file << "\t\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        std::string method_name = cur_token;
        query_tokenizer();

        check_expected_x_after_y("(", ".");
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();

        if (cur_token != ")") {
            parse_expression_list();
            vm_writer.write_call(type_name + "." + method_name, symbol_table.get_temp_arg_count());
        }
        else {
            out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
            query_tokenizer();
        }
    }
    else if (cur_token == "(") {
        std::string method_name = prev_token;
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();

        if (cur_token != ")") {
            parse_expression_list();
            vm_writer.write_call(method_name, symbol_table.get_arg_count(method_name) + 1);
        }
        else {
            check_expected_x_after_y(")", "(");
            out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
            query_tokenizer();
        }
    }
}